

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_16x8_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  __m128i round;
  __m128i scaled_bottom_left;
  __m128i inverted_weights;
  __m128i scale;
  __m128i weights;
  __m128i bottom_left;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_4fc;
  undefined8 *local_448;
  byte local_3c8;
  byte bStack_3c7;
  byte bStack_3c6;
  byte bStack_3c5;
  byte bStack_3c4;
  byte bStack_3c3;
  byte bStack_3c2;
  byte bStack_3c1;
  byte local_388;
  byte bStack_387;
  byte bStack_386;
  byte bStack_385;
  byte bStack_384;
  byte bStack_383;
  byte bStack_382;
  byte bStack_381;
  ushort uStack_316;
  ushort uStack_314;
  ushort uStack_312;
  ushort uStack_30e;
  ushort uStack_30c;
  ushort uStack_30a;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  ushort uStack_136;
  ushort uStack_134;
  ushort uStack_132;
  ushort uStack_12e;
  ushort uStack_12c;
  ushort uStack_12a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  ushort uStack_116;
  ushort uStack_114;
  ushort uStack_112;
  ushort uStack_10e;
  ushort uStack_10c;
  ushort uStack_10a;
  __m128i scaled_bottom_left_y;
  __m128i weights_y;
  __m128i y_select;
  int y_mask;
  __m128i top_hi;
  __m128i top_lo;
  __m128i top;
  
  bVar1 = *(byte *)(in_RCX + 7);
  uStack_316 = (ushort)bVar1;
  uStack_314 = (ushort)bVar1;
  uStack_312 = (ushort)bVar1;
  uStack_30e = (ushort)bVar1;
  uStack_30c = (ushort)bVar1;
  uStack_30a = (ushort)bVar1;
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  local_388 = (byte)uVar2;
  bStack_387 = (byte)((ulong)uVar2 >> 8);
  bStack_386 = (byte)((ulong)uVar2 >> 0x10);
  bStack_385 = (byte)((ulong)uVar2 >> 0x18);
  bStack_384 = (byte)((ulong)uVar2 >> 0x20);
  bStack_383 = (byte)((ulong)uVar2 >> 0x28);
  bStack_382 = (byte)((ulong)uVar2 >> 0x30);
  bStack_381 = (byte)((ulong)uVar2 >> 0x38);
  local_3c8 = (byte)uVar3;
  bStack_3c7 = (byte)((ulong)uVar3 >> 8);
  bStack_3c6 = (byte)((ulong)uVar3 >> 0x10);
  bStack_3c5 = (byte)((ulong)uVar3 >> 0x18);
  bStack_3c4 = (byte)((ulong)uVar3 >> 0x20);
  bStack_3c3 = (byte)((ulong)uVar3 >> 0x28);
  bStack_3c2 = (byte)((ulong)uVar3 >> 0x30);
  bStack_3c1 = (byte)((ulong)uVar3 >> 0x38);
  local_448 = in_RDI;
  for (local_4fc = 0x1000100; local_4fc < 0xf0e0f0f; local_4fc = local_4fc + 0x2020202) {
    auVar5._8_7_ = 0x20002500320049;
    auVar5._0_8_ = 0x69009200c500ff;
    auVar5[0xf] = 0;
    auVar10._8_8_ = CONCAT44(local_4fc,local_4fc);
    auVar10._0_8_ = CONCAT44(local_4fc,local_4fc);
    auVar10 = pshufb(auVar5,auVar10);
    auVar4._2_2_ = uStack_316 * 0x3b;
    auVar4._0_2_ = CONCAT11(0,bVar1);
    auVar4._4_2_ = uStack_314 * 0x6e;
    auVar4._6_2_ = uStack_312 * 0x97;
    auVar4._10_2_ = uStack_30e * 0xce;
    auVar4._8_2_ = CONCAT11(0,bVar1) * 0xb7;
    auVar4._12_2_ = uStack_30c * 0xdb;
    auVar4._14_2_ = uStack_30a * 0xe0;
    auVar11._8_8_ = CONCAT44(local_4fc,local_4fc);
    auVar11._0_8_ = CONCAT44(local_4fc,local_4fc);
    auVar11 = pshufb(auVar4,auVar11);
    uStack_116 = (ushort)bStack_387;
    uStack_114 = (ushort)bStack_386;
    uStack_112 = (ushort)bStack_385;
    uStack_10e = (ushort)bStack_383;
    uStack_10c = (ushort)bStack_382;
    uStack_10a = (ushort)bStack_381;
    local_128 = auVar10._0_2_;
    sStack_126 = auVar10._2_2_;
    sStack_124 = auVar10._4_2_;
    sStack_122 = auVar10._6_2_;
    sStack_120 = auVar10._8_2_;
    sStack_11e = auVar10._10_2_;
    sStack_11c = auVar10._12_2_;
    sStack_11a = auVar10._14_2_;
    uStack_136 = (ushort)bStack_3c7;
    uStack_134 = (ushort)bStack_3c6;
    uStack_132 = (ushort)bStack_3c5;
    uStack_12e = (ushort)bStack_3c3;
    uStack_12c = (ushort)bStack_3c2;
    uStack_12a = (ushort)bStack_3c1;
    local_158 = auVar11._0_2_;
    sStack_156 = auVar11._2_2_;
    sStack_154 = auVar11._4_2_;
    sStack_152 = auVar11._6_2_;
    sStack_150 = auVar11._8_2_;
    sStack_14e = auVar11._10_2_;
    sStack_14c = auVar11._12_2_;
    sStack_14a = auVar11._14_2_;
    uVar6 = local_158 + (ushort)local_388 * local_128 + 0x80;
    uVar12 = sStack_156 + uStack_116 * sStack_126 + 0x80;
    uVar16 = sStack_154 + uStack_114 * sStack_124 + 0x80;
    uVar20 = sStack_152 + uStack_112 * sStack_122 + 0x80;
    uVar24 = sStack_150 + (ushort)bStack_384 * sStack_120 + 0x80;
    uVar28 = sStack_14e + uStack_10e * sStack_11e + 0x80;
    uVar32 = sStack_14c + uStack_10c * sStack_11c + 0x80;
    uVar36 = sStack_14a + uStack_10a * sStack_11a + 0x80;
    uVar7 = uVar6 >> 8;
    uVar13 = uVar12 >> 8;
    uVar17 = uVar16 >> 8;
    uVar21 = uVar20 >> 8;
    uVar25 = uVar24 >> 8;
    uVar29 = uVar28 >> 8;
    uVar33 = uVar32 >> 8;
    uVar37 = uVar36 >> 8;
    uVar8 = local_158 + (ushort)local_3c8 * local_128 + 0x80;
    uVar14 = sStack_156 + uStack_136 * sStack_126 + 0x80;
    uVar18 = sStack_154 + uStack_134 * sStack_124 + 0x80;
    uVar22 = sStack_152 + uStack_132 * sStack_122 + 0x80;
    uVar26 = sStack_150 + (ushort)bStack_3c4 * sStack_120 + 0x80;
    uVar30 = sStack_14e + uStack_12e * sStack_11e + 0x80;
    uVar34 = sStack_14c + uStack_12c * sStack_11c + 0x80;
    uVar38 = sStack_14a + uStack_12a * sStack_11a + 0x80;
    uVar9 = uVar8 >> 8;
    uVar15 = uVar14 >> 8;
    uVar19 = uVar18 >> 8;
    uVar23 = uVar22 >> 8;
    uVar27 = uVar26 >> 8;
    uVar31 = uVar30 >> 8;
    uVar35 = uVar34 >> 8;
    uVar39 = uVar38 >> 8;
    *local_448 = CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar36 >> 8) - (0xff < uVar37),
                          CONCAT16((uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) -
                                   (0xff < uVar33),
                                   CONCAT15((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) -
                                            (0xff < uVar29),
                                            CONCAT14((uVar25 != 0) * (uVar25 < 0x100) *
                                                     (char)(uVar24 >> 8) - (0xff < uVar25),
                                                     CONCAT13((uVar21 != 0) * (uVar21 < 0x100) *
                                                              (char)(uVar20 >> 8) - (0xff < uVar21),
                                                              CONCAT12((uVar17 != 0) *
                                                                       (uVar17 < 0x100) *
                                                                       (char)(uVar16 >> 8) -
                                                                       (0xff < uVar17),
                                                                       CONCAT11((uVar13 != 0) *
                                                                                (uVar13 < 0x100) *
                                                                                (char)(uVar12 >> 8)
                                                                                - (0xff < uVar13),
                                                                                (uVar7 != 0) *
                                                                                (uVar7 < 0x100) *
                                                                                (char)(uVar6 >> 8) -
                                                                                (0xff < uVar7)))))))
                         );
    local_448[1] = CONCAT17((uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar38 >> 8) - (0xff < uVar39)
                            ,CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)(uVar34 >> 8) -
                                      (0xff < uVar35),
                                      CONCAT15((uVar31 != 0) * (uVar31 < 0x100) *
                                               (char)(uVar30 >> 8) - (0xff < uVar31),
                                               CONCAT14((uVar27 != 0) * (uVar27 < 0x100) *
                                                        (char)(uVar26 >> 8) - (0xff < uVar27),
                                                        CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                                 (char)(uVar22 >> 8) -
                                                                 (0xff < uVar23),
                                                                 CONCAT12((uVar19 != 0) *
                                                                          (uVar19 < 0x100) *
                                                                          (char)(uVar18 >> 8) -
                                                                          (0xff < uVar19),
                                                                          CONCAT11((uVar15 != 0) *
                                                                                   (uVar15 < 0x100)
                                                                                   * (char)(uVar14 
                                                  >> 8) - (0xff < uVar15),
                                                  (uVar9 != 0) * (uVar9 < 0x100) *
                                                  (char)(uVar8 >> 8) - (0xff < uVar9))))))));
    local_448 = (undefined8 *)(in_RSI + (long)local_448);
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_16x8_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[7]);
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_bottom_left =
      _mm_mullo_epi16(inverted_weights, bottom_left);
  const __m128i round = _mm_set1_epi16(128);
  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = cvtepu8_epi16(_mm_srli_si128(top, 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}